

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  wchar_t wVar2;
  uint uVar3;
  ImDrawChannel *pIVar4;
  ImWchar *__src;
  ImDrawChannel *pIVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  ImDrawCmd *pIVar13;
  ImWchar *__dest;
  wchar_t wVar14;
  int iVar15;
  wchar_t wVar16;
  long lVar17;
  int iVar18;
  ImDrawCmd *pIVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ImWchar *local_40;
  
  if (this->_Count < 2) {
    return;
  }
  iVar22 = 0;
  SetCurrentChannel(this,draw_list,0);
  ImDrawList::_PopUnusedDrawCmd(draw_list);
  if ((this->_Count < 1) || (lVar11 = (long)(draw_list->CmdBuffer).Size, lVar11 < 1)) {
    pIVar19 = (ImDrawCmd *)0x0;
  }
  else {
    pIVar19 = (draw_list->CmdBuffer).Data + lVar11 + -1;
  }
  if (pIVar19 != (ImDrawCmd *)0x0) {
    iVar22 = pIVar19->ElemCount + pIVar19->IdxOffset;
  }
  iVar18 = 0;
  iVar20 = 0;
  if (1 < this->_Count) {
    iVar20 = 0;
    lVar11 = 1;
    iVar18 = 0;
    do {
      if ((this->_Channels).Size <= lVar11) goto LAB_0020b53a;
      pIVar4 = (this->_Channels).Data;
      pIVar5 = pIVar4 + lVar11;
      wVar2 = pIVar4[lVar11]._CmdBuffer.Size;
      if ((0 < (long)wVar2) && ((pIVar5->_CmdBuffer).Data[(long)wVar2 + -1].ElemCount == 0)) {
        (pIVar5->_CmdBuffer).Size = wVar2 + L'\xffffffff';
      }
      lVar12 = (long)(pIVar5->_CmdBuffer).Size;
      if ((0 < lVar12) && (pIVar19 != (ImDrawCmd *)0x0)) {
        pIVar13 = (pIVar5->_CmdBuffer).Data;
        auVar25[0] = -(*(char *)&(pIVar13->ClipRect).x == *(char *)&(pIVar19->ClipRect).x);
        auVar25[1] = -(*(char *)((long)&(pIVar13->ClipRect).x + 1) ==
                      *(char *)((long)&(pIVar19->ClipRect).x + 1));
        auVar25[2] = -(*(char *)((long)&(pIVar13->ClipRect).x + 2) ==
                      *(char *)((long)&(pIVar19->ClipRect).x + 2));
        auVar25[3] = -(*(char *)((long)&(pIVar13->ClipRect).x + 3) ==
                      *(char *)((long)&(pIVar19->ClipRect).x + 3));
        auVar25[4] = -(*(char *)&(pIVar13->ClipRect).y == *(char *)&(pIVar19->ClipRect).y);
        auVar25[5] = -(*(char *)((long)&(pIVar13->ClipRect).y + 1) ==
                      *(char *)((long)&(pIVar19->ClipRect).y + 1));
        auVar25[6] = -(*(char *)((long)&(pIVar13->ClipRect).y + 2) ==
                      *(char *)((long)&(pIVar19->ClipRect).y + 2));
        auVar25[7] = -(*(char *)((long)&(pIVar13->ClipRect).y + 3) ==
                      *(char *)((long)&(pIVar19->ClipRect).y + 3));
        auVar25[8] = -(*(char *)&(pIVar13->ClipRect).z == *(char *)&(pIVar19->ClipRect).z);
        auVar25[9] = -(*(char *)((long)&(pIVar13->ClipRect).z + 1) ==
                      *(char *)((long)&(pIVar19->ClipRect).z + 1));
        auVar25[10] = -(*(char *)((long)&(pIVar13->ClipRect).z + 2) ==
                       *(char *)((long)&(pIVar19->ClipRect).z + 2));
        auVar25[0xb] = -(*(char *)((long)&(pIVar13->ClipRect).z + 3) ==
                        *(char *)((long)&(pIVar19->ClipRect).z + 3));
        auVar25[0xc] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar19->ClipRect).w);
        auVar25[0xd] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                        *(char *)((long)&(pIVar19->ClipRect).w + 1));
        auVar25[0xe] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                        *(char *)((long)&(pIVar19->ClipRect).w + 2));
        auVar25[0xf] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                        *(char *)((long)&(pIVar19->ClipRect).w + 3));
        auVar23[0] = -(*(char *)&(pIVar13->ClipRect).w == *(char *)&(pIVar19->ClipRect).w);
        auVar23[1] = -(*(char *)((long)&(pIVar13->ClipRect).w + 1) ==
                      *(char *)((long)&(pIVar19->ClipRect).w + 1));
        auVar23[2] = -(*(char *)((long)&(pIVar13->ClipRect).w + 2) ==
                      *(char *)((long)&(pIVar19->ClipRect).w + 2));
        auVar23[3] = -(*(char *)((long)&(pIVar13->ClipRect).w + 3) ==
                      *(char *)((long)&(pIVar19->ClipRect).w + 3));
        auVar23[4] = -(*(char *)&pIVar13->TextureId == *(char *)&pIVar19->TextureId);
        auVar23[5] = -(*(char *)((long)&pIVar13->TextureId + 1) ==
                      *(char *)((long)&pIVar19->TextureId + 1));
        auVar23[6] = -(*(char *)((long)&pIVar13->TextureId + 2) ==
                      *(char *)((long)&pIVar19->TextureId + 2));
        auVar23[7] = -(*(char *)((long)&pIVar13->TextureId + 3) ==
                      *(char *)((long)&pIVar19->TextureId + 3));
        auVar23[8] = -(*(char *)((long)&pIVar13->TextureId + 4) ==
                      *(char *)((long)&pIVar19->TextureId + 4));
        auVar23[9] = -(*(char *)((long)&pIVar13->TextureId + 5) ==
                      *(char *)((long)&pIVar19->TextureId + 5));
        auVar23[10] = -(*(char *)((long)&pIVar13->TextureId + 6) ==
                       *(char *)((long)&pIVar19->TextureId + 6));
        auVar23[0xb] = -(*(char *)((long)&pIVar13->TextureId + 7) ==
                        *(char *)((long)&pIVar19->TextureId + 7));
        auVar23[0xc] = -((char)pIVar13->VtxOffset == (char)pIVar19->VtxOffset);
        auVar23[0xd] = -(*(char *)((long)&pIVar13->VtxOffset + 1) ==
                        *(char *)((long)&pIVar19->VtxOffset + 1));
        auVar23[0xe] = -(*(char *)((long)&pIVar13->VtxOffset + 2) ==
                        *(char *)((long)&pIVar19->VtxOffset + 2));
        auVar23[0xf] = -(*(char *)((long)&pIVar13->VtxOffset + 3) ==
                        *(char *)((long)&pIVar19->VtxOffset + 3));
        auVar23 = auVar23 & auVar25;
        if (((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) &&
           (pIVar13->UserCallback == (ImDrawCallback)0x0 &&
            pIVar19->UserCallback == (ImDrawCallback)0x0)) {
          pIVar19->ElemCount = pIVar19->ElemCount + pIVar13->ElemCount;
          iVar22 = iVar22 + pIVar13->ElemCount;
          memmove(pIVar13,pIVar13 + 1,lVar12 * 0x38 - 0x38);
          (pIVar5->_CmdBuffer).Size = (pIVar5->_CmdBuffer).Size + L'\xffffffff';
        }
      }
      wVar2 = (pIVar5->_CmdBuffer).Size;
      lVar12 = (long)wVar2;
      if (0 < lVar12) {
        pIVar19 = (pIVar5->_CmdBuffer).Data + lVar12 + -1;
      }
      iVar18 = iVar18 + (pIVar5->_IdxBuffer).Size;
      if (L'\0' < wVar2) {
        pIVar13 = (pIVar5->_CmdBuffer).Data;
        lVar17 = 0;
        do {
          *(int *)((long)&pIVar13->IdxOffset + lVar17) = iVar22;
          iVar22 = iVar22 + *(int *)((long)&pIVar13->ElemCount + lVar17);
          lVar17 = lVar17 + 0x38;
        } while (lVar12 * 0x38 - lVar17 != 0);
      }
      iVar20 = iVar20 + wVar2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->_Count);
  }
  iVar15 = (draw_list->CmdBuffer).Size + iVar20;
  iVar22 = (draw_list->CmdBuffer).Capacity;
  if (iVar22 < iVar15) {
    if (iVar22 == 0) {
      iVar21 = 8;
    }
    else {
      iVar21 = iVar22 / 2 + iVar22;
    }
    if (iVar21 <= iVar15) {
      iVar21 = iVar15;
    }
    if (iVar22 < iVar21) {
      pIVar13 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar21 * 0x38);
      pIVar19 = (draw_list->CmdBuffer).Data;
      if (pIVar19 != (ImDrawCmd *)0x0) {
        memcpy(pIVar13,pIVar19,(long)(draw_list->CmdBuffer).Size * 0x38);
        ImGui::MemFree((draw_list->CmdBuffer).Data);
      }
      (draw_list->CmdBuffer).Data = pIVar13;
      (draw_list->CmdBuffer).Capacity = iVar21;
    }
  }
  (draw_list->CmdBuffer).Size = iVar15;
  lVar11 = (long)(draw_list->IdxBuffer).Size + (long)iVar18;
  wVar2 = (draw_list->IdxBuffer).Capacity;
  wVar14 = (wchar_t)lVar11;
  if (wVar2 < wVar14) {
    if (wVar2 == L'\0') {
      wVar16 = L'\b';
    }
    else {
      wVar16 = wVar2 / 2 + wVar2;
    }
    if (wVar16 <= wVar14) {
      wVar16 = wVar14;
    }
    if (wVar2 < wVar16) {
      __dest = (ImWchar *)ImGui::MemAlloc((long)wVar16 * 2);
      __src = (draw_list->IdxBuffer).Data;
      if (__src != (ImWchar *)0x0) {
        memcpy(__dest,__src,(long)(draw_list->IdxBuffer).Size * 2);
        ImGui::MemFree((draw_list->IdxBuffer).Data);
      }
      (draw_list->IdxBuffer).Data = __dest;
      (draw_list->IdxBuffer).Capacity = wVar16;
    }
  }
  (draw_list->IdxBuffer).Size = wVar14;
  local_40 = (draw_list->IdxBuffer).Data + (lVar11 - iVar18);
  if (1 < this->_Count) {
    pIVar19 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar20);
    lVar12 = 1;
    lVar11 = 0x38;
    do {
      if ((this->_Channels).Size <= lVar12) {
LAB_0020b53a:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
      }
      pIVar5 = (this->_Channels).Data;
      lVar17 = (long)*(int *)((long)pIVar5 + lVar11 + -0x18);
      if (lVar17 != 0) {
        memcpy(pIVar19,*(void **)((long)pIVar5 + lVar11 + -0x10),lVar17 * 0x38);
        pIVar19 = pIVar19 + lVar17;
      }
      lVar17 = (long)*(int *)((long)pIVar5 + lVar11 + -8);
      if (lVar17 != 0) {
        memcpy(local_40,*(void **)((long)&(pIVar5->_CmdBuffer).Size + lVar11),lVar17 * 2);
        local_40 = local_40 + lVar17;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar12 < this->_Count);
  }
  draw_list->_IdxWritePtr = local_40;
  uVar3 = (draw_list->CmdBuffer).Size;
  if ((ulong)uVar3 != 0) {
    if ((int)uVar3 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x70f,"T &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
    }
    if ((draw_list->CmdBuffer).Data[(ulong)uVar3 - 1].UserCallback == (ImDrawCallback)0x0)
    goto LAB_0020b4c0;
  }
  ImDrawList::AddDrawCmd(draw_list);
LAB_0020b4c0:
  pIVar19 = (draw_list->CmdBuffer).Data;
  iVar22 = (draw_list->CmdBuffer).Size;
  pIVar13 = pIVar19 + (long)iVar22 + -1;
  pIVar1 = &draw_list->_CmdHeader;
  if (pIVar19[(long)iVar22 + -1].ElemCount == 0) {
    fVar7 = (pIVar1->ClipRect).x;
    fVar8 = (pIVar1->ClipRect).y;
    fVar9 = (draw_list->_CmdHeader).ClipRect.z;
    fVar10 = (draw_list->_CmdHeader).ClipRect.w;
    uVar6 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
    *(undefined8 *)&pIVar19[(long)iVar22 + -1].ClipRect.w =
         *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
    *(undefined8 *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 4) = uVar6;
    (pIVar13->ClipRect).x = fVar7;
    (pIVar13->ClipRect).y = fVar8;
    pIVar19[(long)iVar22 + -1].ClipRect.z = fVar9;
    pIVar19[(long)iVar22 + -1].ClipRect.w = fVar10;
  }
  else {
    auVar26[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar13->ClipRect).x);
    auVar26[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.x + 1));
    auVar26[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.x + 2));
    auVar26[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.x + 3));
    auVar26[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                  *(char *)&pIVar19[(long)iVar22 + -1].ClipRect.y);
    auVar26[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.y + 1));
    auVar26[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.y + 2));
    auVar26[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.y + 3));
    auVar26[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                  *(char *)&pIVar19[(long)iVar22 + -1].ClipRect.z);
    auVar26[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.z + 1));
    auVar26[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                   *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.z + 2));
    auVar26[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.z + 3));
    auVar26[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar19[(long)iVar22 + -1].ClipRect.w);
    auVar26[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 1));
    auVar26[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 2));
    auVar26[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 3));
    auVar24[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                  *(char *)&pIVar19[(long)iVar22 + -1].ClipRect.w);
    auVar24[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 1));
    auVar24[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 2));
    auVar24[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].ClipRect.w + 3));
    auVar24[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                  *(char *)&pIVar19[(long)iVar22 + -1].TextureId);
    auVar24[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 1));
    auVar24[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 2));
    auVar24[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 3));
    auVar24[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 4));
    auVar24[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                  *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 5));
    auVar24[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                   *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 6));
    auVar24[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].TextureId + 7));
    auVar24[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                    (char)pIVar19[(long)iVar22 + -1].VtxOffset);
    auVar24[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].VtxOffset + 1));
    auVar24[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].VtxOffset + 2));
    auVar24[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                    *(char *)((long)&pIVar19[(long)iVar22 + -1].VtxOffset + 3));
    auVar24 = auVar24 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) {
      ImDrawList::AddDrawCmd(draw_list);
    }
  }
  this->_Count = 1;
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}